

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void JX9_DIR_Const(jx9_value *pVal,void *pUserData)

{
  int local_34;
  char *pcStack_30;
  int nLen;
  char *zDir;
  SyString *pFile;
  jx9_vm *pVm;
  void *pUserData_local;
  jx9_value *pVal_local;
  
  pFile = (SyString *)pUserData;
  pVm = (jx9_vm *)pUserData;
  pUserData_local = pVal;
  zDir = (char *)SySetPeek((SySet *)((long)pUserData + 0x3e0));
  if (zDir == (char *)0x0) {
    jx9_value_string((jx9_value *)pUserData_local,":MEMORY:",8);
  }
  else if (*(int *)(zDir + 8) == 0) {
    jx9_value_string((jx9_value *)pUserData_local,".",1);
  }
  else {
    pcStack_30 = jx9ExtractDirName(*(char **)zDir,*(int *)(zDir + 8),&local_34);
    jx9_value_string((jx9_value *)pUserData_local,pcStack_30,local_34);
  }
  return;
}

Assistant:

static void JX9_DIR_Const(jx9_value *pVal, void *pUserData)
{
	jx9_vm *pVm = (jx9_vm *)pUserData;
	SyString *pFile;
	/* Peek the top entry */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	if( pFile == 0 ){
		/* Expand the magic word: ":MEMORY:" */
		jx9_value_string(pVal, ":MEMORY:", (int)sizeof(":MEMORY:")-1);
	}else{
		if( pFile->nByte > 0 ){
			const char *zDir;
			int nLen;
			zDir = jx9ExtractDirName(pFile->zString, (int)pFile->nByte, &nLen);
			jx9_value_string(pVal, zDir, nLen);
		}else{
			/* Expand '.' as the current directory*/
			jx9_value_string(pVal, ".", (int)sizeof(char));
		}
	}
}